

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O1

void Ifd_ManStop(Ifd_Man_t *p)

{
  uint uVar1;
  int *piVar2;
  word *__ptr;
  Hsh_IntMan_t *__ptr_00;
  Vec_Wrd_t *__ptr_01;
  Vec_Int_t *pVVar3;
  uint uVar4;
  long lVar5;
  
  pVVar3 = p->vMarks;
  if (1 < pVVar3->nSize) {
    lVar5 = 1;
    uVar4 = 0;
    do {
      uVar1 = pVVar3->pArray[lVar5];
      printf("%d(%d:%d) ",(ulong)((int)lVar5 - 1),(ulong)uVar1,(ulong)(uVar1 - uVar4));
      lVar5 = lVar5 + 1;
      pVVar3 = p->vMarks;
      uVar4 = uVar1;
    } while (lVar5 < pVVar3->nSize);
  }
  putchar(10);
  if (p->vArgs != (Vec_Int_t *)0x0) {
    piVar2 = p->vArgs->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vArgs->pArray = (int *)0x0;
    }
    if (p->vArgs != (Vec_Int_t *)0x0) {
      free(p->vArgs);
      p->vArgs = (Vec_Int_t *)0x0;
    }
  }
  if (p->vRes != (Vec_Int_t *)0x0) {
    piVar2 = p->vRes->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vRes->pArray = (int *)0x0;
    }
    if (p->vRes != (Vec_Int_t *)0x0) {
      free(p->vRes);
      p->vRes = (Vec_Int_t *)0x0;
    }
  }
  if (p->vTruths != (Vec_Wrd_t *)0x0) {
    __ptr = p->vTruths->pArray;
    if (__ptr != (word *)0x0) {
      free(__ptr);
      p->vTruths->pArray = (word *)0x0;
    }
    if (p->vTruths != (Vec_Wrd_t *)0x0) {
      free(p->vTruths);
      p->vTruths = (Vec_Wrd_t *)0x0;
    }
  }
  if (p->vClauses != (Vec_Int_t *)0x0) {
    piVar2 = p->vClauses->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vClauses->pArray = (int *)0x0;
    }
    if (p->vClauses != (Vec_Int_t *)0x0) {
      free(p->vClauses);
      p->vClauses = (Vec_Int_t *)0x0;
    }
  }
  if (p->vMarks != (Vec_Int_t *)0x0) {
    piVar2 = p->vMarks->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vMarks->pArray = (int *)0x0;
    }
    if (p->vMarks != (Vec_Int_t *)0x0) {
      free(p->vMarks);
      p->vMarks = (Vec_Int_t *)0x0;
    }
  }
  __ptr_00 = p->vHash;
  pVVar3 = __ptr_00->vTable;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  __ptr_01 = __ptr_00->vObjs;
  if (__ptr_01->pArray != (word *)0x0) {
    free(__ptr_01->pArray);
    __ptr_01->pArray = (word *)0x0;
  }
  if (__ptr_01 != (Vec_Wrd_t *)0x0) {
    free(__ptr_01);
  }
  if (__ptr_00 != (Hsh_IntMan_t *)0x0) {
    free(__ptr_00);
  }
  if (p->vSuper != (Vec_Int_t *)0x0) {
    piVar2 = p->vSuper->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vSuper->pArray = (int *)0x0;
    }
    if (p->vSuper != (Vec_Int_t *)0x0) {
      free(p->vSuper);
      p->vSuper = (Vec_Int_t *)0x0;
    }
  }
  if (p->pObjs != (Ifd_Obj_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Ifd_Obj_t *)0x0;
  }
  free(p);
  return;
}

Assistant:

void Ifd_ManStop( Ifd_Man_t * p )
{
    int i, This, Prev = 0;
    Vec_IntForEachEntryStart( p->vMarks, This, i, 1 )
    {
        printf( "%d(%d:%d) ", i-1, This, This - Prev );
        Prev = This;
    }
    printf( "\n" );

    Vec_IntFreeP( &p->vArgs );
    Vec_IntFreeP( &p->vRes );
    Vec_WrdFreeP( &p->vTruths );
    Vec_IntFreeP( &p->vClauses );
    Vec_IntFreeP( &p->vMarks );
    Hsh_IntManStop( p->vHash );
    Vec_IntFreeP( &p->vSuper );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}